

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfocusframe.cpp
# Opt level: O0

void __thiscall QFocusFramePrivate::updateSize(QFocusFramePrivate *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  QWidget *this_00;
  QStyle *pQVar7;
  QWidget *parent;
  QWidget *pQVar8;
  QFocusFramePrivate *in_RDI;
  long in_FS_OFFSET;
  QRect QVar9;
  int hmargin;
  int vmargin;
  QFocusFrame *q;
  QStyleHintReturnMask mask;
  QRect geom;
  QPoint pos;
  QStyleOption opt;
  int in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  QWidget *in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  QStyleOption *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  undefined1 *local_88;
  undefined1 *local_80;
  QRect local_78;
  undefined1 *local_68;
  undefined1 *local_60;
  QPoint local_58;
  QPoint local_50;
  undefined1 local_48 [16];
  undefined8 local_38;
  undefined8 local_30;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &q_func(in_RDI)->super_QWidget;
  if (in_RDI->widget != (QWidget *)0x0) {
    memset(local_48,0xaa,0x40);
    QStyleOption::QStyleOption
              (in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,in_stack_ffffffffffffff40);
    (**(code **)(*(long *)this_00 + 0x1a0))(this_00,local_48);
    pQVar7 = QWidget::style((QWidget *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28)
                           );
    iVar2 = (**(code **)(*(long *)pQVar7 + 0xe0))(pQVar7,0x40,local_48,this_00);
    pQVar7 = QWidget::style((QWidget *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28)
                           );
    iVar3 = (**(code **)(*(long *)pQVar7 + 0xe0))(pQVar7,0x41,local_48,this_00);
    local_50 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
    iVar4 = QWidget::x((QWidget *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    QWidget::y((QWidget *)CONCAT44(iVar4,in_stack_ffffffffffffff40));
    QPoint::QPoint((QPoint *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                   in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
    parent = QWidget::parentWidget((QWidget *)0x49c5cb);
    pQVar8 = QWidget::parentWidget((QWidget *)0x49c5e4);
    if (parent != pQVar8) {
      in_stack_ffffffffffffff38 = QWidget::parentWidget((QWidget *)0x49c602);
      QWidget::parentWidget((QWidget *)0x49c611);
      local_58 = QWidget::mapTo((QWidget *)in_RDI,parent,
                                (QPoint *)CONCAT44(iVar4,in_stack_ffffffffffffff40));
      local_50 = local_58;
    }
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    local_60 = &DAT_aaaaaaaaaaaaaaaa;
    iVar4 = QPoint::x((QPoint *)0x49c663);
    iVar4 = iVar4 - iVar3;
    iVar5 = QPoint::y((QPoint *)0x49c678);
    iVar5 = iVar5 - iVar2;
    iVar6 = QWidget::width((QWidget *)0x49c693);
    iVar6 = iVar6 + iVar3 * 2;
    QWidget::height((QWidget *)0x49c6b2);
    QRect::QRect((QRect *)in_stack_ffffffffffffff38,iVar6,iVar5,iVar4,in_stack_ffffffffffffff28);
    QWidget::geometry(this_00);
    bVar1 = ::operator==((QRect *)CONCAT44(iVar6,iVar5),
                         (QRect *)CONCAT44(iVar4,in_stack_ffffffffffffff28));
    if (!bVar1) {
      QWidget::setGeometry(this_00,(QRect *)CONCAT44(iVar2,iVar3));
      QVar9 = QWidget::rect(parent);
      local_78._0_8_ = QVar9._0_8_;
      local_38._0_4_ = local_78.x1.m_i;
      local_38._4_4_ = local_78.y1.m_i;
      local_78._8_8_ = QVar9._8_8_;
      local_30._0_4_ = local_78.x2.m_i;
      local_30._4_4_ = local_78.y2.m_i;
      local_88 = &DAT_aaaaaaaaaaaaaaaa;
      local_80 = &DAT_aaaaaaaaaaaaaaaa;
      local_78 = QVar9;
      QStyleHintReturnMask::QStyleHintReturnMask((QStyleHintReturnMask *)CONCAT44(iVar6,iVar5));
      pQVar7 = QWidget::style((QWidget *)CONCAT44(iVar4,in_stack_ffffffffffffff28));
      iVar4 = (**(code **)(*(long *)pQVar7 + 0xf0))(pQVar7,0x35,local_48,this_00,&local_88);
      if (iVar4 != 0) {
        QWidget::setMask((QWidget *)CONCAT44(iVar2,iVar3),
                         (QRegion *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      }
      QStyleHintReturnMask::~QStyleHintReturnMask((QStyleHintReturnMask *)CONCAT44(iVar6,iVar5));
    }
    QStyleOption::~QStyleOption((QStyleOption *)CONCAT44(iVar6,iVar5));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFocusFramePrivate::updateSize()
{
    Q_Q(QFocusFrame);
    if (!widget)
        return;

    QStyleOption opt;
    q->initStyleOption(&opt);
    int vmargin = q->style()->pixelMetric(QStyle::PM_FocusFrameVMargin, &opt, q),
        hmargin = q->style()->pixelMetric(QStyle::PM_FocusFrameHMargin, &opt, q);
    QPoint pos(widget->x(), widget->y());
    if (q->parentWidget() != widget->parentWidget())
        pos = widget->parentWidget()->mapTo(q->parentWidget(), pos);
    QRect geom(pos.x()-hmargin, pos.y()-vmargin,
               widget->width()+(hmargin*2), widget->height()+(vmargin*2));
    if (q->geometry() == geom)
        return;

    q->setGeometry(geom);

    opt.rect = q->rect();
    QStyleHintReturnMask mask;
    if (q->style()->styleHint(QStyle::SH_FocusFrame_Mask, &opt, q, &mask))
        q->setMask(mask.region);
}